

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_s2c_opening *in_stack_000000b8;
  secp256k1_sha256 *in_stack_000000c0;
  int *in_stack_000000c8;
  secp256k1_scalar *in_stack_000000d0;
  secp256k1_scalar *in_stack_000000d8;
  secp256k1_context *in_stack_000000e0;
  uchar *in_stack_000000f0;
  uchar *in_stack_000000f8;
  uchar *in_stack_00000100;
  secp256k1_nonce_function in_stack_00000108;
  void *in_stack_00000110;
  char *in_stack_ffffffffffffff48;
  secp256k1_callback *in_stack_ffffffffffffff50;
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  long local_30;
  long local_28;
  secp256k1_ecdsa_signature *local_20;
  int local_c;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_c = 0;
  }
  else if (local_28 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_c = 0;
  }
  else if (local_20 == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_c = 0;
  }
  else if (local_30 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_c = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_sign_inner
                      (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                       in_stack_000000c0,in_stack_000000b8,in_stack_000000f0,in_stack_000000f8,
                       in_stack_00000100,in_stack_00000108,in_stack_00000110);
    secp256k1_ecdsa_signature_save(local_20,&local_60,&local_80);
    local_c = iVar1;
  }
  return local_c;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, NULL, NULL, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}